

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcElement::IfcElement(IfcElement *this)

{
  *(undefined ***)&this->field_0x138 = &PTR__Object_00816a50;
  *(undefined8 *)&this->field_0x140 = 0;
  *(char **)&this->field_0x148 = "IfcElement";
  IfcProduct::IfcProduct(&this->super_IfcProduct,&PTR_construction_vtable_24__0081fa38);
  *(undefined8 *)&(this->super_IfcProduct).field_0x108 = 0;
  *(undefined8 *)&(this->super_IfcProduct).super_IfcObject = 0x81f958;
  *(undefined8 *)&this->field_0x138 = 0x81fa20;
  *(undefined8 *)&(this->super_IfcProduct).super_IfcObject.field_0x88 = 0x81f980;
  (this->super_IfcProduct).super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x81f9a8;
  *(undefined8 *)&(this->super_IfcProduct).super_IfcObject.field_0xd0 = 0x81f9d0;
  *(undefined8 *)&(this->super_IfcProduct).field_0x100 = 0x81f9f8;
  *(undefined1 **)&(this->super_IfcProduct).field_0x110 = &this->field_0x120;
  *(undefined8 *)&this->field_0x118 = 0;
  this->field_0x120 = 0;
  this->field_0x130 = 0;
  return;
}

Assistant:

IfcElement() : Object("IfcElement") {}